

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O3

Sat_MmStep_t * Sat_MmStepStart(int nSteps)

{
  undefined1 auVar1 [16];
  int iVar2;
  Sat_MmStep_t *pSVar3;
  Sat_MmFixed_t **ppSVar4;
  Sat_MmFixed_t **ppSVar5;
  char **ppcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  Sat_MmFixed_t *pSVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pSVar3 = (Sat_MmStep_t *)malloc(0x30);
  pSVar3->nMems = nSteps;
  pSVar11 = (Sat_MmFixed_t *)(long)nSteps;
  ppSVar4 = (Sat_MmFixed_t **)malloc((long)pSVar11 * 8);
  pSVar3->pMems = ppSVar4;
  if (0 < nSteps) {
    uVar12 = 0;
    do {
      pSVar11 = Sat_MmFixedStart(8 << ((byte)uVar12 & 0x1f));
      ppSVar4[uVar12] = pSVar11;
      uVar12 = uVar12 + 1;
    } while ((uint)nSteps != uVar12);
    pSVar11 = *ppSVar4;
  }
  iVar2 = 4 << ((byte)nSteps & 0x1f);
  pSVar3->nMapSize = iVar2;
  ppSVar5 = (Sat_MmFixed_t **)malloc((long)(iVar2 + 1) << 3);
  pSVar3->pMap = ppSVar5;
  *ppSVar5 = (Sat_MmFixed_t *)0x0;
  auVar13._8_4_ = (int)pSVar11;
  auVar13._0_8_ = pSVar11;
  auVar13._12_4_ = (int)((ulong)pSVar11 >> 0x20);
  *(undefined1 (*) [16])(ppSVar5 + 1) = auVar13;
  *(undefined1 (*) [16])(ppSVar5 + 3) = auVar13;
  auVar1 = _DAT_007ee2e0;
  auVar13 = _DAT_007ee2d0;
  if (0 < nSteps) {
    uVar12 = 0;
    do {
      iVar8 = 4 << ((byte)uVar12 & 0x1f);
      iVar2 = 8 << ((byte)uVar12 & 0x1f);
      if (iVar8 < iVar2) {
        pSVar11 = ppSVar4[uVar12];
        uVar7 = (iVar2 - iVar8) - 4;
        uVar9 = uVar7 | 3;
        auVar14._4_4_ = 0;
        auVar14._0_4_ = uVar9;
        auVar14._8_4_ = uVar9;
        auVar14._12_4_ = 0;
        auVar14 = auVar14 ^ auVar1;
        lVar10 = 0;
        do {
          auVar15._8_4_ = (int)lVar10;
          auVar15._0_8_ = lVar10;
          auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar15 = (auVar15 | auVar13) ^ auVar1;
          if ((bool)(~(auVar14._4_4_ < auVar15._4_4_ ||
                      auVar14._0_4_ < auVar15._0_4_ && auVar15._4_4_ == auVar14._4_4_) & 1)) {
            ppSVar5[(long)iVar8 + lVar10 + 1] = pSVar11;
          }
          if (auVar15._12_4_ <= auVar14._12_4_ &&
              (auVar15._8_4_ <= auVar14._8_4_ || auVar15._12_4_ != auVar14._12_4_)) {
            ppSVar5[(long)iVar8 + lVar10 + 2] = pSVar11;
          }
          lVar10 = lVar10 + 2;
        } while ((ulong)uVar7 + 4 != lVar10);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uint)nSteps);
  }
  pSVar3->nChunksAlloc = 0x40;
  pSVar3->nChunks = 0;
  ppcVar6 = (char **)malloc(0x200);
  pSVar3->pChunks = ppcVar6;
  return pSVar3;
}

Assistant:

Sat_MmStep_t * Sat_MmStepStart( int nSteps )
{
    Sat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Sat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Sat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Sat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Sat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}